

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_CCtxParams_init_advanced
                 (ZSTD_CCtx_params *cctxParams,ZSTD_parameters params)

{
  size_t sVar1;
  
  if (cctxParams == (ZSTD_CCtx_params *)0x0) {
    sVar1 = 0xffffffffffffffff;
  }
  else {
    sVar1 = ZSTD_checkCParams(params.cParams);
    if (sVar1 < 0xffffffffffffff89) {
      sVar1 = 0;
      ZSTD_CCtxParams_init_internal(cctxParams,&params,0);
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_CCtxParams_init_advanced(ZSTD_CCtx_params* cctxParams, ZSTD_parameters params)
{
    RETURN_ERROR_IF(!cctxParams, GENERIC, "NULL pointer!");
    FORWARD_IF_ERROR( ZSTD_checkCParams(params.cParams) , "");
    ZSTD_CCtxParams_init_internal(cctxParams, &params, ZSTD_NO_CLEVEL);
    return 0;
}